

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndChild(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  float fVar5;
  ImVec2 sz;
  ImRect bb;
  ImVec2 local_48;
  ImRect local_40;
  ImRect local_30;
  
  pIVar4 = GImGui;
  if (GImGui->WithinEndChild != false) {
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x13b3,"void ImGui::EndChild()");
  }
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->Flags & 0x1000000) != 0) {
    GImGui->WithinEndChild = true;
    if (pIVar2->BeginCount < 2) {
      local_48 = pIVar2->Size;
      if ((pIVar2->AutoFitChildAxises & 1U) != 0) {
        fVar5 = 4.0;
        if (4.0 <= local_48.x) {
          fVar5 = local_48.x;
        }
        local_48.x = fVar5;
      }
      if ((pIVar2->AutoFitChildAxises & 2U) != 0) {
        fVar5 = 4.0;
        if (4.0 <= local_48.y) {
          fVar5 = local_48.y;
        }
        local_48.y = fVar5;
      }
      End();
      pIVar3 = pIVar4->CurrentWindow;
      local_40.Max.x = (pIVar3->DC).CursorPos.x + local_48.x;
      local_40.Max.y = (pIVar3->DC).CursorPos.y + local_48.y;
      local_40.Min = (pIVar3->DC).CursorPos;
      ItemSize(&local_48,-1.0);
      if ((((pIVar2->DC).NavLayersActiveMask == 0) && ((pIVar2->DC).NavHasScroll != true)) ||
         ((pIVar2->Flags & 0x800000) != 0)) {
        ItemAdd(&local_40,0,(ImRect *)0x0,0);
      }
      else {
        ItemAdd(&local_40,pIVar2->ChildId,(ImRect *)0x0,0);
        RenderNavHighlight(&local_40,pIVar2->ChildId,1);
        if (((pIVar2->DC).NavLayersActiveMask == 0) && (pIVar2 == pIVar4->NavWindow)) {
          local_30.Min.x = local_40.Min.x + -2.0;
          local_30.Min.y = local_40.Min.y + -2.0;
          local_30.Max.x = local_40.Max.x + 2.0;
          local_30.Max.y = local_40.Max.y + 2.0;
          RenderNavHighlight(&local_30,pIVar4->NavId,2);
        }
      }
      if (pIVar4->HoveredWindow == pIVar2) {
        pIVar1 = &(pIVar3->DC).LastItemStatusFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
      }
    }
    else {
      End();
    }
    pIVar4->WithinEndChild = false;
    pIVar4->LogLinePosY = -3.4028235e+38;
    return;
  }
  __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x13b4,"void ImGui::EndChild()");
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayersActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayersActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2, 2), bb.Max + ImVec2(2, 2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
        if (g.HoveredWindow == window)
            parent_window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredWindow;
    }
    g.WithinEndChild = false;
    g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}